

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::MergeFrom
          (BiDirectionalLSTMLayerParams *this,BiDirectionalLSTMLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  LSTMParams *pLVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb609);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,
             &(from->activationsforwardlstm_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,
             &(from->activationsbackwardlstm_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
            (&(this->weightparams_).super_RepeatedPtrFieldBase,
             &(from->weightparams_).super_RepeatedPtrFieldBase);
  if ((from != (BiDirectionalLSTMLayerParams *)&_BiDirectionalLSTMLayerParams_default_instance_) &&
     (from->params_ != (LSTMParams *)0x0)) {
    if (this->params_ == (LSTMParams *)0x0) {
      pLVar2 = (LSTMParams *)operator_new(0x20);
      LSTMParams::LSTMParams(pLVar2);
      this->params_ = pLVar2;
    }
    pLVar2 = from->params_;
    if (pLVar2 == (LSTMParams *)0x0) {
      pLVar2 = (LSTMParams *)&_LSTMParams_default_instance_;
    }
    LSTMParams::MergeFrom(this->params_,pLVar2);
  }
  if (from->inputvectorsize_ != 0) {
    this->inputvectorsize_ = from->inputvectorsize_;
  }
  if (from->outputvectorsize_ != 0) {
    this->outputvectorsize_ = from->outputvectorsize_;
  }
  return;
}

Assistant:

void BiDirectionalLSTMLayerParams::MergeFrom(const BiDirectionalLSTMLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  activationsforwardlstm_.MergeFrom(from.activationsforwardlstm_);
  activationsbackwardlstm_.MergeFrom(from.activationsbackwardlstm_);
  weightparams_.MergeFrom(from.weightparams_);
  if (from.has_params()) {
    mutable_params()->::CoreML::Specification::LSTMParams::MergeFrom(from.params());
  }
  if (from.inputvectorsize() != 0) {
    set_inputvectorsize(from.inputvectorsize());
  }
  if (from.outputvectorsize() != 0) {
    set_outputvectorsize(from.outputvectorsize());
  }
}